

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O1

void unpackforblock23(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint32_t *puVar14;
  uint uVar15;
  
  puVar1 = (ulong *)*pw;
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  uVar6 = puVar1[4];
  uVar7 = puVar1[5];
  uVar8 = puVar1[6];
  uVar9 = puVar1[7];
  uVar10 = puVar1[8];
  uVar11 = puVar1[9];
  uVar12 = puVar1[10];
  uVar13 = puVar1[0xb];
  puVar14 = *pout;
  *pw = (uint8_t *)((long)puVar1 + 0x5c);
  *puVar14 = ((uint)uVar2 & 0x7fffff) + base;
  puVar14[1] = ((uint)(uVar2 >> 0x17) & 0x7fffff) + base;
  puVar14[2] = ((uint)(uVar3 << 0x12) & 0x7fffff | (uint)(uVar2 >> 0x2e)) + base;
  puVar14[3] = ((uint)(uVar3 >> 5) & 0x7fffff) + base;
  puVar14[4] = ((uint)(uVar3 >> 0x1c) & 0x7fffff) + base;
  puVar14[5] = ((uint)(uVar4 << 0xd) & 0x7fffff | (uint)(uVar3 >> 0x33)) + base;
  puVar14[6] = ((uint)(uVar4 >> 10) & 0x7fffff) + base;
  puVar14[7] = ((uint)(uVar4 >> 0x21) & 0x7fffff) + base;
  puVar14[8] = ((uint)(uVar5 << 8) & 0x7fffff | (uint)(byte)(uVar4 >> 0x38)) + base;
  puVar14[9] = ((uint)(uVar5 >> 0xf) & 0x7fffff) + base;
  uVar15 = (uint)(uVar5 >> 0x20);
  puVar14[0xe] = ((uint)(uVar7 >> 2) & 0x7fffff) + base;
  puVar14[0xf] = ((uint)(uVar7 >> 0x19) & 0x7fffff) + base;
  puVar14[0x10] = ((uint)(uVar8 << 0x10) & 0x7fffff | (uint)(ushort)(uVar7 >> 0x30)) + base;
  puVar14[0x11] = ((uint)(uVar8 >> 7) & 0x7fffff) + base;
  puVar14[10] = (uVar15 >> 6 & 0x7fffff) + base;
  puVar14[0xb] = ((uint)(uVar6 << 3) & 0x7fffff | uVar15 >> 0x1d) + base;
  puVar14[0xc] = ((uint)(uVar6 >> 0x14) & 0x7fffff) + base;
  puVar14[0xd] = ((uint)(uVar7 << 0x15) & 0x7fffff | (uint)(uVar6 >> 0x2b)) + base;
  puVar14[0x12] = ((uint)(uVar8 >> 0x1e) & 0x7fffff) + base;
  puVar14[0x13] = ((uint)(uVar9 << 0xb) & 0x7fffff | (uint)(uVar8 >> 0x35)) + base;
  puVar14[0x14] = ((uint)(uVar9 >> 0xc) & 0x7fffff) + base;
  uVar15 = (uint)(uVar9 >> 0x20);
  puVar14[0x15] = (uVar15 >> 3 & 0x7fffff) + base;
  puVar14[0x16] = ((uint)(uVar10 << 6) & 0x7fffff | uVar15 >> 0x1a) + base;
  puVar14[0x17] = ((uint)(uVar10 >> 0x11) & 0x7fffff) + base;
  uVar15 = (uint)(uVar10 >> 0x20);
  puVar14[0x18] = (uVar15 >> 8 & 0x7fffff) + base;
  puVar14[0x19] = ((uint)(uVar11 << 1) & 0x7fffff | uVar15 >> 0x1f) + base;
  puVar14[0x1a] = ((uint)(uVar11 >> 0x16) & 0x7fffff) + base;
  puVar14[0x1b] = ((uint)(uVar12 << 0x13) & 0x7fffff | (uint)(uVar11 >> 0x2d)) + base;
  puVar14[0x1c] = ((uint)(uVar12 >> 4) & 0x7fffff) + base;
  puVar14[0x1d] = ((uint)(uVar12 >> 0x1b) & 0x7fffff) + base;
  puVar14[0x1e] = ((uint)(uVar13 << 0xe) & 0x7fffff | (uint)(uVar12 >> 0x32)) + base;
  puVar14[0x1f] = ((uint)(uVar13 >> 9) & 0x7fffff) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock23(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(8388607);
  /* we are going to access  12 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  uint64_t w11 = pw64[11];
  *pw += 92; /* we used up 92 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 23) & mask);
  out[2] = base + (uint32_t)(((w0 >> 46) | (w1 << 18)) & mask);
  out[3] = base + (uint32_t)((w1 >> 5) & mask);
  out[4] = base + (uint32_t)((w1 >> 28) & mask);
  out[5] = base + (uint32_t)(((w1 >> 51) | (w2 << 13)) & mask);
  out[6] = base + (uint32_t)((w2 >> 10) & mask);
  out[7] = base + (uint32_t)((w2 >> 33) & mask);
  out[8] = base + (uint32_t)(((w2 >> 56) | (w3 << 8)) & mask);
  out[9] = base + (uint32_t)((w3 >> 15) & mask);
  out[10] = base + (uint32_t)((w3 >> 38) & mask);
  out[11] = base + (uint32_t)(((w3 >> 61) | (w4 << 3)) & mask);
  out[12] = base + (uint32_t)((w4 >> 20) & mask);
  out[13] = base + (uint32_t)(((w4 >> 43) | (w5 << 21)) & mask);
  out[14] = base + (uint32_t)((w5 >> 2) & mask);
  out[15] = base + (uint32_t)((w5 >> 25) & mask);
  out[16] = base + (uint32_t)(((w5 >> 48) | (w6 << 16)) & mask);
  out[17] = base + (uint32_t)((w6 >> 7) & mask);
  out[18] = base + (uint32_t)((w6 >> 30) & mask);
  out[19] = base + (uint32_t)(((w6 >> 53) | (w7 << 11)) & mask);
  out[20] = base + (uint32_t)((w7 >> 12) & mask);
  out[21] = base + (uint32_t)((w7 >> 35) & mask);
  out[22] = base + (uint32_t)(((w7 >> 58) | (w8 << 6)) & mask);
  out[23] = base + (uint32_t)((w8 >> 17) & mask);
  out[24] = base + (uint32_t)((w8 >> 40) & mask);
  out[25] = base + (uint32_t)(((w8 >> 63) | (w9 << 1)) & mask);
  out[26] = base + (uint32_t)((w9 >> 22) & mask);
  out[27] = base + (uint32_t)(((w9 >> 45) | (w10 << 19)) & mask);
  out[28] = base + (uint32_t)((w10 >> 4) & mask);
  out[29] = base + (uint32_t)((w10 >> 27) & mask);
  out[30] = base + (uint32_t)(((w10 >> 50) | (w11 << 14)) & mask);
  out[31] = base + (uint32_t)((w11 >> 9) & mask);
  *pout += 32; /* we wrote 32 32-bit integers */
}